

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.h
# Opt level: O0

void * calloc(size_t __nmemb,size_t __size)

{
  size_t size_local;
  size_t num_local;
  
  if (s_useDLMalloc) {
    num_local = (size_t)dlcalloc(__nmemb,__size);
  }
  else {
    num_local = (size_t)cookmem::
                        MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                        ::callocate(&s_memCtx.
                                     super_MemContext<cookmem::CachedArena<cookmem::MmapArena>,_cookmem::NoActionMemLogger,_void>
                                    ,__nmemb,__size);
  }
  return (void *)num_local;
}

Assistant:

void*
calloc (std::size_t num, std::size_t size)
{
    if (s_useDLMalloc)
    {
        return dlcalloc(num, size);
    }
    else
    {
        return s_memCtx.callocate(num, size);
    }
}